

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe24At5(uint8_t *buf)

{
  return (ulong)(((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 7) << 0x10) << 5 | (uint)(buf[3] >> 3))
  ;
}

Assistant:

std::uint64_t readFlUIntBe24At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 5;
    res |= (buf[3] >> 3);
    res &= UINT64_C(0xffffff);
    return res;
}